

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

bool ptc::Print<char>::is_escape<char[1]>(char (*str) [1],ANSI *flag)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  if (*flag == generic) {
    local_18._M_len = strlen(*str);
    local_18._M_str = *str;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_18,'\x1b',0);
    bVar1 = sVar3 != 0xffffffffffffffff;
  }
  else if (*flag == first) {
    sVar2 = strlen(*str);
    bVar1 = (*str)[0] == '\x1b' && sVar2 < 7;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static constexpr bool is_escape( const T& str, const ANSI& flag )
     {
      if constexpr( std::is_convertible_v <T, std::basic_string_view<T_str>> && ! std::is_same_v<T, std::nullptr_t> )
       {
        switch( flag )
         {
          case( ANSI::first ): 
           {
            return ( std::basic_string_view<T_str>( str ).length() < 7 ) && ( str[0] == '\033' );
           }
          case( ANSI::generic ):
           {
            return ( std::basic_string_view<T_str>( str ).find( '\033' ) != std::basic_string_view<T_str>::npos );
           }
         }
       }
      return false;
     }